

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::ram_loaded(Snes_Spc *this)

{
  Snes_Spc *in_RDI;
  
  (in_RDI->m).rom_enabled = 0;
  load_regs(in_RDI,(in_RDI->m).ram.ram + 0xf0);
  memset(&(in_RDI->m).ram,0xff,0x100);
  memset((in_RDI->m).ram.padding2,0xff,0x100);
  return;
}

Assistant:

void Snes_Spc::ram_loaded()
{
	m.rom_enabled = 0;
	load_regs( &RAM [0xF0] );
	
	// Put STOP instruction around memory to catch PC underflow/overflow
	memset( m.ram.padding1, cpu_pad_fill, sizeof m.ram.padding1 );
	memset( m.ram.padding2, cpu_pad_fill, sizeof m.ram.padding2 );
}